

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_rem_intra_pred_mode(bitstream *str,h264_cabac_context *cabac,uint32_t *val)

{
  int iVar1;
  int local_38;
  uint local_34;
  int i;
  uint32_t bit [3];
  uint32_t *val_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  bit._4_8_ = val;
  if (cabac == (h264_cabac_context *)0x0) {
    str_local._4_4_ = vs_u(str,val,3);
  }
  else {
    for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
      (&local_34)[local_38] = *(uint *)bit._4_8_ >> ((byte)local_38 & 0x1f) & 1;
      iVar1 = h264_cabac_decision(str,cabac,0x45,&local_34 + local_38);
      if (iVar1 != 0) {
        return 1;
      }
    }
    if (str->dir == VS_DECODE) {
      *(uint *)bit._4_8_ = local_34 | i << 1 | bit[0] << 2;
    }
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

int h264_rem_intra_pred_mode(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *val) {
	if (!cabac)
		return vs_u(str, val, 3);
	uint32_t bit[3];
	int i;
	for (i = 0; i < 3; i++) {
		bit[i] = *val >> i & 1;
		if (h264_cabac_decision(str, cabac, H264_CABAC_CTXIDX_REM_INTRA_PRED_MODE, &bit[i])) return 1;
	}
	if (str->dir == VS_DECODE) {
		*val = bit[0] | bit[1] << 1 | bit[2] << 2;
	}
	return 0;
}